

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertexTag ON_SubD::VertexTagFromUnsigned(uint vertex_tag_as_unsigned)

{
  ON_SubDVertexTag local_9;
  uint vertex_tag_as_unsigned_local;
  
  switch(vertex_tag_as_unsigned) {
  case 0:
    local_9 = Unset;
    break;
  case 1:
    local_9 = Smooth;
    break;
  case 2:
    local_9 = Crease;
    break;
  case 3:
    local_9 = Corner;
    break;
  case 4:
    local_9 = Dart;
    break;
  default:
    ON_SubDIncrementErrorCount();
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_SubDVertexTag ON_SubD::VertexTagFromUnsigned(
  unsigned int vertex_tag_as_unsigned
  )
{
  switch (vertex_tag_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Smooth);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Crease);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Corner);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Dart);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDVertexTag::Unset);
}